

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coherent_memory_write.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  GLbitfield GVar1;
  GLint GVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  int iVar6;
  byte bVar7;
  byte bVar8;
  void *pvVar9;
  void *pvVar10;
  int i_1;
  int iVar11;
  GLuint GVar12;
  GLuint GVar13;
  GLuint GVar14;
  GLenum GVar15;
  GLint GVar16;
  GLint GVar17;
  GLFWwindow *handle;
  void *pvVar18;
  GLsync p_Var19;
  void *pvVar20;
  float *pfVar21;
  long lVar22;
  long lVar23;
  GLuint *pGVar24;
  float *pfVar25;
  int iVar26;
  char *__s;
  int iVar27;
  int x;
  long lVar28;
  float *vertices;
  long lVar29;
  void **ppvVar30;
  int i;
  float fVar31;
  float fVar32;
  uint local_31c;
  int success;
  int local_2e4;
  int local_2e0;
  int iStack_2dc;
  int local_2d8;
  int local_2d4;
  int local_2d0;
  int local_2cc;
  long local_2c8;
  long local_2c0;
  long local_2b8;
  GLint alignment;
  size_t mapping_offsets [9];
  int local_258 [138];
  
  glfwInit();
  local_31c = 1;
  glfwWindowHint(0x20004,1);
  glfwWindowHint(0x22002,4);
  glfwWindowHint(0x22003,3);
  glfwWindowHint(0x22006,1);
  glfwWindowHint(0x22008,0x32001);
  handle = glfwCreateWindow(0x400,0x400,"Coherent memory write",(GLFWmonitor *)0x0,(GLFWwindow *)0x0
                           );
  if (handle == (GLFWwindow *)0x0) {
    local_31c = 0x7d;
  }
  else {
    glfwMakeContextCurrent(handle);
    iVar11 = gladLoadGLLoader(glfwGetProcAddress);
    if (iVar11 != 0) {
      (*glad_glGetIntegerv)(0x90df,&alignment);
      mapping_offsets[3] = sysconf(0x1e);
      mapping_offsets[0] = 0;
      mapping_offsets[1] = (size_t)alignment;
      mapping_offsets[2] = mapping_offsets[3] >> 1;
      mapping_offsets[4] = mapping_offsets[3] + mapping_offsets[1];
      mapping_offsets[5] = mapping_offsets[3] - mapping_offsets[1];
      mapping_offsets[6] = mapping_offsets[3] * 2;
      mapping_offsets[7] = mapping_offsets[3] * 10;
      mapping_offsets[8] = mapping_offsets[3] * 4 + mapping_offsets[1] * 2;
      GVar12 = (*glad_glCreateShader)(0x8b31);
      (*glad_glShaderSource)(GVar12,1,&vert_shader_text,(GLint *)0x0);
      (*glad_glCompileShader)(GVar12);
      (*glad_glGetShaderiv)(GVar12,0x8b81,&success);
      if (success == 0) {
        (*glad_glGetShaderInfoLog)(GVar12,0x200,(GLsizei *)0x0,(GLchar *)(local_258 + 8));
        printf("Vertex shader compilation failed: %s\n",local_258 + 8);
      }
      GVar13 = (*glad_glCreateShader)(0x8b30);
      (*glad_glShaderSource)(GVar13,1,&frag_shader_text,(GLint *)0x0);
      (*glad_glCompileShader)(GVar13);
      (*glad_glGetShaderiv)(GVar13,0x8b81,&success);
      if (success == 0) {
        (*glad_glGetShaderInfoLog)(GVar13,0x200,(GLsizei *)0x0,(GLchar *)(local_258 + 8));
        printf("Fragment shader compilation failed:%s\n",local_258 + 8);
      }
      GVar14 = (*glad_glCreateProgram)();
      (*glad_glAttachShader)(GVar14,GVar12);
      (*glad_glAttachShader)(GVar14,GVar13);
      (*glad_glLinkProgram)(GVar14);
      (*glad_glGetProgramiv)(GVar14,0x8b82,&success);
      if (success == 0) {
        (*glad_glGetProgramInfoLog)(GVar14,0x200,(GLsizei *)0x0,(GLchar *)(local_258 + 8));
        printf("Program linking failed: %s\n",local_258 + 8);
      }
      (*glad_glDeleteShader)(GVar12);
      (*glad_glDeleteShader)(GVar13);
      if (GVar14 == 0) {
        __assert_fail("prog",
                      "/workspace/llm4binary/github/license_c_cmakelists/apitrace[P]apitrace-tests/apps/gl/coherent_memory_write.cpp"
                      ,0x99,"void build_programm()");
      }
      bVar7 = 1;
      lVar29 = 0;
      while (lVar29 != 2) {
        GVar1 = (&DAT_0012f068)[lVar29];
        local_2c8 = lVar29;
        lVar29 = 0;
        while (lVar29 != 9) {
          local_2c0 = lVar29;
          sVar5 = mapping_offsets[lVar29];
          pGVar24 = ssbo;
          (*glad_glGenBuffers)(3,ssbo);
          ppvVar30 = coherent_colors;
          lVar29 = 0;
          while (lVar29 != 3) {
            (*glad_glBindBufferRange)(0x90d2,(GLuint)lVar29,*pGVar24,sVar5,0x40000);
            (*glad_glBufferStorage)(0x90d2,sVar5 + 0x40000,(void *)0x0,GVar1);
            pvVar18 = (*glad_glMapNamedBufferRange)(*pGVar24,sVar5,0x40000,GVar1);
            *ppvVar30 = pvVar18;
            (*glad_glBindBuffer)(0x90d2,0);
            check_error();
            lVar29 = lVar29 + 1;
            ppvVar30 = ppvVar30 + 1;
            GVar12 = *pGVar24;
            pGVar24 = pGVar24 + 1;
            if (GVar12 == 0) {
              __assert_fail("ssbo[i]",
                            "/workspace/llm4binary/github/license_c_cmakelists/apitrace[P]apitrace-tests/apps/gl/coherent_memory_write.cpp"
                            ,0xaf,
                            "bool setup_buffers(const int, const int, const size_t, const GLenum)");
            }
          }
          (*glad_glGenFramebuffers)(1,&fbo);
          (*glad_glBindFramebuffer)(0x8d40,fbo);
          (*glad_glGenRenderbuffers)(1,&rbo);
          (*glad_glBindRenderbuffer)(0x8d41,rbo);
          (*glad_glRenderbufferStorage)(0x8d41,0x1908,0x100,0x100);
          (*glad_glFramebufferRenderbuffer)(0x8d40,0x8ce0,0x8d41,rbo);
          (*glad_glGenBuffers)(1,&vbo);
          (*glad_glBindBuffer)(0x8892,vbo);
          (*glad_glBufferStorage)(0x8892,0xc0,(void *)0x0,GVar1);
          pvVar18 = (*glad_glMapBufferRange)(0x8892,0,0xc0,GVar1);
          (*glad_glGenVertexArrays)(1,&vao);
          (*glad_glBindVertexArray)(vao);
          (*glad_glVertexAttribPointer)(0,3,0x1406,'\0',0xc,(void *)0x0);
          (*glad_glEnableVertexAttribArray)(0);
          GVar15 = (*glad_glCheckFramebufferStatus)(0x8d40);
          if (GVar15 != 0x8cd5) {
            return 1;
          }
          (*glad_glBindFramebuffer)(0x8d40,0);
          check_error();
          bVar7 = 1;
          lVar29 = 0;
          while (lVar29 != 3) {
            iVar11 = (&DAT_0012f500)[lVar29 * 2];
            GVar2 = (&DAT_0012f504)[lVar29 * 2];
            local_2b8 = lVar29;
            (*glad_glBindVertexArray)(vao);
            (*glad_glBindBuffer)(0x8892,vbo);
            pGVar24 = ssbo;
            for (lVar29 = 0; lVar29 != 3; lVar29 = lVar29 + 1) {
              (*glad_glBindBufferRange)(0x90d2,(GLuint)lVar29,*pGVar24,sVar5,0x40000);
              pGVar24 = pGVar24 + 1;
            }
            (*glad_glUseProgram)(GVar14);
            (*glad_glBindFramebuffer)(0x8d40,fbo);
            (*glad_glViewport)(0,0,0x100,0x100);
            (*glad_glClearColor)(1.0,0.0,0.0,1.0);
            (*glad_glClear)(0x4000);
            local_258[0] = -0x80;
            local_258[1] = -0x80;
            local_258[2] = 0;
            local_258[3] = -0x80;
            local_258[4] = -0x80;
            local_258[5] = 0;
            local_258[6] = 0;
            local_258[7] = 0;
            GVar16 = (*glad_glGetUniformLocation)(GVar14,"width");
            if (GVar16 != -1) {
              (*glad_glUniform1i)(GVar16,0x100);
            }
            local_258[8] = -0x80;
            local_258[9] = -0x80;
            local_258[10] = 0;
            local_258[0xb] = -0x80;
            local_258[0xc] = -0x80;
            local_258[0xd] = 0;
            local_258[0xe] = 0;
            local_258[0xf] = 0;
            lVar22 = 0;
            fVar31 = (float)DAT_0012f040;
            fVar32 = DAT_0012f040._4_4_;
            for (lVar29 = 0; lVar29 != 4; lVar29 = lVar29 + 1) {
              success = local_258[lVar29 * 2 + 8];
              local_2e4 = local_258[lVar29 * 2 + 9];
              local_2e0 = success;
              iStack_2dc = local_2e4 + 0x80;
              local_2d8 = success + 0x80;
              local_2d4 = local_2e4;
              local_2d0 = success + 0x80;
              local_2cc = local_2e4 + 0x80;
              lVar22 = (long)(int)lVar22;
              for (lVar23 = 0; lVar23 != 4; lVar23 = lVar23 + 1) {
                *(ulong *)((long)pvVar18 + lVar22 * 4) =
                     CONCAT44((float)(int)((ulong)*(undefined8 *)(&success + lVar23 * 2) >> 0x20) *
                              fVar32,(float)(int)*(undefined8 *)(&success + lVar23 * 2) * fVar31);
                *(undefined4 *)((long)pvVar18 + lVar22 * 4 + 8) = 0;
                lVar22 = lVar22 + 3;
              }
            }
            for (lVar29 = 0; lVar29 != 4; lVar29 = lVar29 + 1) {
              iVar3 = local_258[lVar29 * 2];
              iVar4 = local_258[lVar29 * 2 + 1];
              lVar22 = (long)iVar4 + 0x80;
              iVar6 = iVar11;
              if (iVar3 + 0x80 == 0) {
                iVar6 = 0;
              }
              GVar16 = GVar2;
              if ((int)lVar22 == 0) {
                GVar16 = 0;
              }
              GVar17 = (*glad_glGetUniformLocation)(GVar14,"offset_x");
              if (GVar17 != -1) {
                (*glad_glUniform1i)(GVar17,iVar6);
              }
              GVar17 = (*glad_glGetUniformLocation)(GVar14,"offset_y");
              if (GVar17 != -1) {
                (*glad_glUniform1i)(GVar17,GVar16);
              }
              pvVar10 = coherent_colors[2];
              pvVar9 = coherent_colors[1];
              pvVar20 = coherent_colors[0];
              iVar26 = iVar4 * 0x100 + iVar3 + 0x8080;
              for (; lVar22 != (long)iVar4 + 0x100; lVar22 = lVar22 + 1) {
                iVar27 = iVar26;
                for (lVar23 = (long)(iVar3 + 0x80); lVar23 < (long)iVar3 + 0x100;
                    lVar23 = lVar23 + 1) {
                  lVar28 = (long)(iVar27 - (GVar16 * 0x100 + iVar6));
                  *(float *)((long)pvVar20 + lVar28 * 4) = (float)(int)lVar23 * 0.00390625;
                  *(float *)((long)pvVar9 + lVar28 * 4) = (float)(int)lVar22 * 0.00390625;
                  *(float *)((long)pvVar10 + lVar28 * 4) = (float)iVar27 * 1.5258789e-05;
                  iVar27 = iVar27 + 1;
                }
                iVar26 = iVar26 + 0x100;
              }
              (*glad_glDrawArrays)(5,(int)lVar29 * 4,4);
              if ((iVar6 == 0) || (GVar16 == 0)) {
                p_Var19 = (*glad_glFenceSync)(0x9117,0);
                (*glad_glClientWaitSync)(p_Var19,1,0xffffffffffffffff);
              }
            }
            (*glad_glBindFramebuffer)(0x8ca8,fbo);
            (*glad_glBindFramebuffer)(0x8ca9,0);
            (*glad_glBlitFramebuffer)(0,0,0x100,0x100,0,0,0x400,0x400,0x4000,0x2600);
            for (GVar12 = 0; GVar12 != 3; GVar12 = GVar12 + 1) {
              (*glad_glBindBufferBase)(0x90d2,GVar12,0);
            }
            (*glad_glBindBuffer)(0x8892,0);
            (*glad_glBindVertexArray)(0);
            glfwSwapBuffers(handle);
            glfwPollEvents();
            pvVar20 = operator_new__(0x100000);
            (*glad_glReadBuffer)(0x8ce0);
            (*glad_glReadPixels)(0,0,0x100,0x100,0x1908,0x1406,pvVar20);
            pfVar21 = (float *)((long)pvVar20 + 0xc);
            bVar8 = 1;
            iVar11 = 0;
            for (lVar29 = 0; lVar29 != 0x100; lVar29 = lVar29 + 1) {
              pfVar25 = pfVar21;
              for (lVar22 = 0; lVar22 != 0x100; lVar22 = lVar22 + 1) {
                if ((((0.01 < ABS((float)(int)lVar22 * -0.00390625 + pfVar25[-3])) ||
                     (0.01 < ABS(pfVar25[-2] - (float)(int)lVar29 * 0.00390625))) ||
                    (0.01 < ABS(pfVar25[-1] - (float)(iVar11 + (int)lVar22) * 1.5258789e-05))) ||
                   (0.01 < ABS(*pfVar25 + -1.0))) {
                  bVar8 = 0;
                }
                pfVar25 = pfVar25 + 4;
              }
              iVar11 = iVar11 + 0x100;
              pfVar21 = pfVar21 + 0x400;
            }
            operator_delete__(pvVar20);
            bVar7 = bVar8 & bVar7;
            lVar29 = local_2b8 + 1;
          }
          pGVar24 = ssbo;
          for (lVar29 = 0; lVar29 != 3; lVar29 = lVar29 + 1) {
            (*glad_glBindBufferRange)(0x90d2,(GLuint)lVar29,*pGVar24,sVar5,0x40000);
            (*glad_glUnmapNamedBuffer)(*pGVar24);
            (*glad_glBindBufferBase)(0x90d2,(GLuint)lVar29,0);
            pGVar24 = pGVar24 + 1;
          }
          (*glad_glBindVertexArray)(vao);
          (*glad_glBindBuffer)(0x8892,vbo);
          (*glad_glUnmapBuffer)(0x8892);
          (*glad_glBindBuffer)(0x8892,0);
          (*glad_glBindVertexArray)(0);
          lVar29 = local_2c0 + 1;
        }
        lVar29 = local_2c8 + 1;
      }
      glfwDestroyWindow(handle);
      glfwTerminate();
      __s = "Probe failed ";
      if (bVar7 != 0) {
        __s = "Passed successfully ";
      }
      puts(__s);
      local_31c = (uint)(byte)~bVar7;
    }
  }
  return local_31c;
}

Assistant:

int
main(int argc, char** argv) {
    glfwInit();

    glfwWindowHint(GLFW_VISIBLE, GLFW_TRUE);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 4);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 3);
    glfwWindowHint(GLFW_OPENGL_FORWARD_COMPAT, GL_TRUE);
    glfwWindowHint(GLFW_OPENGL_PROFILE, GLFW_OPENGL_CORE_PROFILE);

    GLFWwindow* window = glfwCreateWindow(1024, 1024, "Coherent memory write", NULL, NULL);

    if (!window) {
        return EXIT_SKIP;
    }

    glfwMakeContextCurrent(window);

    if (!gladLoadGLLoader((GLADloadproc)glfwGetProcAddress)) {
        return EXIT_FAILURE;
    }

    GLint alignment;
    glGetIntegerv(GL_SHADER_STORAGE_BUFFER_OFFSET_ALIGNMENT, &alignment);
    const size_t page_size = getSystemPageSize();
    const size_t ssbo_alignment = static_cast<const size_t>(alignment);

    bool pass = true;
    const int width = 256;
    const int height = 256;

    const int mapping_offsets_count = 9;
    const size_t mapping_offsets[mapping_offsets_count] = {
        0,
        ssbo_alignment,
        page_size / 2,
        page_size,
        page_size + ssbo_alignment,
        page_size - ssbo_alignment,
        page_size * 2,
        page_size * 10,
        page_size * 4 + 2 * ssbo_alignment
    };

    const int quads_offstes_count = 3;
    const int quads_offsets[quads_offstes_count][2] = {
        { width / 4, height / 4 },
        { width / 2, height / 2 },
        { 0, 0 }
    };

    const int mapping_flags_count = 2;
    const GLenum mapping_flags[mapping_flags_count] = {
        GL_MAP_WRITE_BIT | GL_MAP_PERSISTENT_BIT | GL_MAP_COHERENT_BIT,
        GL_MAP_WRITE_BIT | GL_MAP_READ_BIT | GL_MAP_PERSISTENT_BIT | GL_MAP_COHERENT_BIT
    };

    build_programm();

    for (int i = 0; i < mapping_flags_count; i++) {
        for (int j = 0; j < mapping_offsets_count; j++) {
            pass = setup_buffers(width, height, mapping_offsets[j], mapping_flags[i]);

            if (!pass) {
                return EXIT_FAILURE;
            }

            for (int k = 0; k < quads_offstes_count; k++) {
                draw(window, width, height, mapping_offsets[j],
                    quads_offsets[k][0], quads_offsets[k][1],
                    mapping_flags[i]);

                pass = probe(width, height) && pass;
            }
            unmap_buffers(width, height, mapping_offsets[j]);
        }
    }

    glfwDestroyWindow(window);
    glfwTerminate();

    if (pass) {
        printf("Passed successfully \n");
    } else {
        printf("Probe failed \n");
    }

    return pass ? 0 : EXIT_FAILURE;
}